

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

uint16_t gpio_read(uint32_t address)

{
  gpio_port_t gVar1;
  uint uVar2;
  uint in_EDI;
  gpio_port_t port;
  
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] [GPIO] gpio read from address 0x%08X\n",(ulong)in_EDI);
  }
  if ((bus->allow_gpio_read & 1U) != 0) {
    uVar2 = in_EDI & 0xf;
    if (uVar2 == 4) {
      if (bus->gpio_device == RTC) {
        gVar1 = gba_rtc_read();
        return (ushort)(bus->gpio_read_mask & gVar1.raw);
      }
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/gpio.c",
              0x13);
      fprintf(_stderr,"Read from data port for unimplemented device %d\n\x1b[0;m",
              (ulong)bus->gpio_device);
      exit(1);
    }
    if (uVar2 == 6) {
      return (ushort)bus->gpio_write_mask;
    }
    if (uVar2 == 8) {
      return (ushort)(bus->allow_gpio_read & 1);
    }
  }
  return 0;
}

Assistant:

half gpio_read(word address) {
    logdebug("[GPIO] gpio read from address 0x%08X", address);
    if (bus->allow_gpio_read) {
        switch (address & 0xF) {
            case 0x4: // Data
                switch (bus->gpio_device) {
                    case RTC: {
                        gpio_port_t port = gba_rtc_read();
                        return bus->gpio_read_mask & port.raw;
                    }
                    default:
                        logfatal("Read from data port for unimplemented device %d", bus->gpio_device)
                }
                break;
            case 0x6:
                return bus->gpio_write_mask;
            case 0x8:
                return bus->allow_gpio_read & 1;
        }
    }
    return 0;
}